

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

char __thiscall lscpp::stdio_transporter::read_char(stdio_transporter *this)

{
  char local_11;
  stdio_transporter *psStack_10;
  char c;
  stdio_transporter *this_local;
  
  psStack_10 = this;
  read(0,&local_11,1);
  anon_unknown_0::log_in_char(&this->comm_logger_,&local_11);
  return local_11;
}

Assistant:

char stdio_transporter::read_char() {
  char c;
  ::read(stdin_fileno, &c, 1);

  log_in_char(comm_logger_, c);

  return c;
}